

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

int SSE16x16_SSE2(uint8_t *a,uint8_t *b)

{
  int iVar1;
  
  iVar1 = SSE_16xN_SSE2(a,b,8);
  return iVar1;
}

Assistant:

static int SSE16x16_SSE2(const uint8_t* a, const uint8_t* b) {
  return SSE_16xN_SSE2(a, b, 8);
}